

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O3

void __thiscall
Diligent::TextureBaseGL::TextureBaseGL
          (TextureBaseGL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          TextureDesc *TexDesc,GLenum BindTarget,TextureData *pInitData,bool bIsDeviceInternal)

{
  RefCntAutoPtr<Diligent::IBuffer> *pRVar1;
  USAGE UVar2;
  GLenum GVar3;
  uint uVar4;
  string *Args_1;
  Uint32 ArraySlice;
  string StagingBuffName;
  string msg_1;
  undefined1 local_98 [32];
  Uint64 local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  TextureBase<Diligent::EngineGLImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceGL,TexDesc,bIsDeviceInternal);
  (this->super_AsyncWritableResource).m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00af38c0;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlTexture,TexDesc->Usage != USAGE_STAGING,(GLTextureCreateReleaseHelper)0x0);
  pRVar1 = &this->m_pPBO;
  (this->m_pPBO).m_pObject = (IBuffer *)0x0;
  this->m_BindTarget = BindTarget;
  GVar3 = TexFormatToGLInternalTexFormat
                    ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc.Format,
                     (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc.BindFlags);
  this->m_GLTexFormat = GVar3;
  if (GVar3 == 0) {
    FormatString<char[27]>((string *)local_98,(char (*) [27])"Unsupported texture format");
    DebugAssertionFailed
              ((Char *)local_98._0_8_,"TextureBaseGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x42);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,
                      CONCAT26(local_98._22_2_,
                               CONCAT15(local_98[0x15],CONCAT14(local_98[0x14],local_98._16_4_))) +
                      1);
    }
  }
  UVar2 = TexDesc->Usage;
  if (pInitData == (TextureData *)0x0 && UVar2 == USAGE_IMMUTABLE) {
    LogError<true,char[66]>
              (false,"TextureBaseGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x44,(char (*) [66])
                     "Immutable textures must be initialized with data at creation time");
    UVar2 = TexDesc->Usage;
  }
  if (UVar2 == USAGE_STAGING) {
    local_98._16_4_ = 0;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = 0;
    local_98[0x14] = '\x01';
    local_98[0x15] = '\0';
    local_98._22_2_ = 0;
    local_98._24_4_ = 0;
    local_78 = 1;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Internal staging buffer of texture \'","");
    std::__cxx11::string::append((char *)local_70);
    std::__cxx11::string::push_back((char)local_70);
    local_98._0_8_ = local_70[0];
    ArraySlice = 1;
    uVar4 = (uint)(this->super_TextureBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  .m_Desc.Type;
    if ((uVar4 < 9) && ((0x1a8U >> (uVar4 & 0x1f) & 1) != 0)) {
      ArraySlice = (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                   .m_Desc.field_3.ArraySize;
    }
    local_98._8_8_ =
         GetStagingTextureLocationOffset
                   (&(this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc,ArraySlice,0,4,0,0,0);
    local_98[0x14] = '\x03';
    local_98[0x15] = TexDesc->CPUAccessFlags;
    local_50._M_dataplus._M_p = (pointer)pRVar1->m_pObject;
    Args_1 = &local_50;
    local_50._M_string_length = (size_type)pRVar1;
    RenderDeviceGLImpl::CreateBuffer
              (pDeviceGL,(BufferDesc *)local_98,(BufferData *)0x0,(IBuffer **)Args_1);
    RefCntAutoPtr<Diligent::IBuffer>::DoublePtrHelper<Diligent::IBuffer>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::IBuffer> *)&local_50);
    if (pRVar1->m_pObject == (IBuffer *)0x0) {
      FormatString<char[26],char[7]>
                (&local_50,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pPBO",
                 (char (*) [7])Args_1);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"TextureBaseGL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x53);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  return;
}

Assistant:

TextureBaseGL::TextureBaseGL(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceGLImpl*        pDeviceGL,
                             const TextureDesc&         TexDesc,
                             GLenum                     BindTarget,
                             const TextureData*         pInitData /*= nullptr*/,
                             bool                       bIsDeviceInternal /*= false*/) :
    // clang-format off
    TTextureBase
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        bIsDeviceInternal
    },
    m_GlTexture     {TexDesc.Usage != USAGE_STAGING},
    m_BindTarget    {BindTarget },
    m_GLTexFormat   {TexFormatToGLInternalTexFormat(m_Desc.Format, m_Desc.BindFlags)}
    //m_uiMapTarget(0)
// clang-format on
{
    VERIFY(m_GLTexFormat != 0, "Unsupported texture format");
    if (TexDesc.Usage == USAGE_IMMUTABLE && pInitData == nullptr)
        LOG_ERROR_AND_THROW("Immutable textures must be initialized with data at creation time");

    if (TexDesc.Usage == USAGE_STAGING)
    {
        BufferDesc  StagingBufferDesc;
        std::string StagingBuffName = "Internal staging buffer of texture '";
        StagingBuffName += m_Desc.Name;
        StagingBuffName += '\'';
        StagingBufferDesc.Name = StagingBuffName.c_str();

        StagingBufferDesc.Size           = GetStagingTextureDataSize(m_Desc, PBOOffsetAlignment);
        StagingBufferDesc.Usage          = USAGE_STAGING;
        StagingBufferDesc.CPUAccessFlags = TexDesc.CPUAccessFlags;

        pDeviceGL->CreateBuffer(StagingBufferDesc, nullptr, &m_pPBO);
        VERIFY_EXPR(m_pPBO);
    }
}